

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O1

void __thiscall wasm::OptimizationOptions::addDefaultOptPasses(OptimizationOptions *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Storage<int,_true> _Var2;
  _Storage<int,_true> _Var3;
  PassInfo local_80;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"O","");
  _Var2 = (_Storage<int,_true>)(this->super_ToolOptions).passOptions.optimizeLevel;
  _Var3 = (_Storage<int,_true>)(this->super_ToolOptions).passOptions.shrinkLevel;
  paVar1 = &local_80.name.field_2;
  local_80.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_50,local_48 + (long)local_50);
  local_80.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = true;
  local_80.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = true;
  local_80.optimizeLevel.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_payload = _Var2;
  local_80.shrinkLevel.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_payload = _Var3;
  std::
  vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ::emplace_back<wasm::OptimizationOptions::PassInfo>(&this->passes,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.name._M_dataplus._M_p,local_80.name.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void addDefaultOptPasses() {
    passes.push_back(PassInfo{
      DEFAULT_OPT_PASSES, passOptions.optimizeLevel, passOptions.shrinkLevel});
  }